

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_avx2_256_8.c
# Opt level: O1

parasail_result_t *
parasail_nw_diag_avx2_256_8
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  parasail_result_t *ppVar22;
  undefined1 (*ptr) [16];
  int8_t *ptr_00;
  int8_t *ptr_01;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  char cVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  char cVar33;
  uint uVar34;
  uint uVar35;
  int iVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  ulong uVar55;
  char cVar56;
  ulong uVar57;
  ulong uVar58;
  char cVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar65 [16];
  undefined1 auVar64 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar74 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  uint local_2b0;
  int local_224;
  int8_t *local_200;
  uint local_1d0;
  undefined1 local_168 [32];
  
  auVar74 = in_ZMM11._0_16_;
  auVar65 = in_ZMM8._0_16_;
  if (_s2 == (char *)0x0) {
    parasail_nw_diag_avx2_256_8_cold_7();
  }
  else if (s2Len < 1) {
    parasail_nw_diag_avx2_256_8_cold_6();
  }
  else if (open < 0) {
    parasail_nw_diag_avx2_256_8_cold_5();
  }
  else if (gap < 0) {
    parasail_nw_diag_avx2_256_8_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_diag_avx2_256_8_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_nw_diag_avx2_256_8_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar58 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_nw_diag_avx2_256_8_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar58 = (ulong)(uint)matrix->length;
    }
    iVar36 = -open;
    iVar21 = matrix->min;
    uVar42 = (uint)(byte)-(char)iVar21;
    if (iVar21 != iVar36 && SBORROW4(iVar21,iVar36) == iVar21 + open < 0) {
      uVar42 = open;
    }
    cVar33 = '~' - (char)matrix->max;
    ppVar22 = parasail_result_new();
    if (ppVar22 != (parasail_result_t *)0x0) {
      ppVar22->flag = ppVar22->flag | 0x20101001;
      uVar55 = (ulong)(s2Len + 0x3e);
      ptr = (undefined1 (*) [16])parasail_memalign_int8_t(0x20,uVar55);
      ptr_00 = parasail_memalign_int8_t(0x20,uVar55);
      ptr_01 = parasail_memalign_int8_t(0x20,uVar55);
      if (ptr_01 != (int8_t *)0x0 && (ptr_00 != (int8_t *)0x0 && ptr != (undefined1 (*) [16])0x0)) {
        uVar41 = (uint)uVar58;
        if (matrix->type == 0) {
          iVar21 = uVar41 + 0x1f;
          local_200 = parasail_memalign_int8_t(0x20,(long)iVar21);
          if (local_200 == (int8_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < (int)uVar41) {
            uVar55 = 0;
            do {
              local_200[uVar55] = (int8_t)matrix->mapper[(byte)_s1[uVar55]];
              uVar55 = uVar55 + 1;
            } while (uVar58 != uVar55);
          }
          iVar1 = uVar41 + 1;
          if ((int)(uVar41 + 1) < iVar21) {
            iVar1 = iVar21;
          }
          memset(local_200 + (int)uVar41,0,(ulong)(~uVar41 + iVar1) + 1);
        }
        else {
          local_200 = (int8_t *)0x0;
        }
        uVar39 = s2Len + 0x1f;
        uVar16 = uVar41 - 1;
        auVar77 = vpinsrb_avx(ZEXT416((uint)(gap * 0xf1 - open)),gap * 0xf2 - open,1);
        auVar77 = vpinsrb_avx(auVar77,gap * 0xf3 - open,2);
        auVar77 = vpinsrb_avx(auVar77,gap * 0xf4 - open,3);
        auVar77 = vpinsrb_avx(auVar77,gap * 0xf5 - open,4);
        auVar77 = vpinsrb_avx(auVar77,gap * 0xf6 - open,5);
        auVar77 = vpinsrb_avx(auVar77,gap * 0xf7 - open,6);
        auVar77 = vpinsrb_avx(auVar77,iVar36 + gap * -8,7);
        auVar77 = vpinsrb_avx(auVar77,gap * 0xf9 - open,8);
        auVar77 = vpinsrb_avx(auVar77,gap * 0xfa - open,9);
        auVar77 = vpinsrb_avx(auVar77,gap * 0xfb - open,10);
        auVar77 = vpinsrb_avx(auVar77,iVar36 + gap * -4,0xb);
        auVar77 = vpinsrb_avx(auVar77,gap * 0xfd - open,0xc);
        local_224 = s2Len + -1;
        cVar26 = (char)uVar42 + -0x7f;
        cVar59 = (char)open;
        auVar68[8] = 0xe0;
        auVar68._0_8_ = 0xe0e0e0e0e0e0e0e0;
        auVar68[9] = 0xe0;
        auVar68[10] = 0xe0;
        auVar68[0xb] = 0xe0;
        auVar68[0xc] = 0xe0;
        auVar68[0xd] = 0xe0;
        auVar68[0xe] = 0xe0;
        auVar68[0xf] = 0xe0;
        auVar68[0x10] = 0xe0;
        auVar68[0x11] = 0xe0;
        auVar68[0x12] = 0xe0;
        auVar68[0x13] = 0xe0;
        auVar68[0x14] = 0xe0;
        auVar68[0x15] = 0xe0;
        auVar68[0x16] = 0xe0;
        auVar68[0x17] = 0xe0;
        auVar68[0x18] = 0xe0;
        auVar68[0x19] = 0xe0;
        auVar68[0x1a] = 0xe0;
        auVar68[0x1b] = 0xe0;
        auVar68[0x1c] = 0xe0;
        auVar68[0x1d] = 0xe0;
        auVar68[0x1e] = 0xe0;
        auVar68[0x1f] = 0xe0;
        auVar60[0] = (char)gap;
        auVar60[1] = auVar60[0];
        auVar60[2] = auVar60[0];
        auVar60[3] = auVar60[0];
        auVar60[4] = auVar60[0];
        auVar60[5] = auVar60[0];
        auVar60[6] = auVar60[0];
        auVar60[7] = auVar60[0];
        auVar60[8] = auVar60[0];
        auVar60[9] = auVar60[0];
        auVar60[10] = auVar60[0];
        auVar60[0xb] = auVar60[0];
        auVar60[0xc] = auVar60[0];
        auVar60[0xd] = auVar60[0];
        auVar60[0xe] = auVar60[0];
        auVar60[0xf] = auVar60[0];
        auVar60[0x10] = auVar60[0];
        auVar60[0x11] = auVar60[0];
        auVar60[0x12] = auVar60[0];
        auVar60[0x13] = auVar60[0];
        auVar60[0x14] = auVar60[0];
        auVar60[0x15] = auVar60[0];
        auVar60[0x16] = auVar60[0];
        auVar60[0x17] = auVar60[0];
        auVar60[0x18] = auVar60[0];
        auVar60[0x19] = auVar60[0];
        auVar60[0x1a] = auVar60[0];
        auVar60[0x1b] = auVar60[0];
        auVar60[0x1c] = auVar60[0];
        auVar60[0x1d] = auVar60[0];
        auVar60[0x1e] = auVar60[0];
        auVar60[0x1f] = auVar60[0];
        auVar61 = vpsllw_avx2(auVar60,5);
        auVar7 = vpand_avx2(auVar61,auVar68);
        auVar61[0] = (undefined1)uVar58;
        auVar61[1] = auVar61[0];
        auVar61[2] = auVar61[0];
        auVar61[3] = auVar61[0];
        auVar61[4] = auVar61[0];
        auVar61[5] = auVar61[0];
        auVar61[6] = auVar61[0];
        auVar61[7] = auVar61[0];
        auVar61[8] = auVar61[0];
        auVar61[9] = auVar61[0];
        auVar61[10] = auVar61[0];
        auVar61[0xb] = auVar61[0];
        auVar61[0xc] = auVar61[0];
        auVar61[0xd] = auVar61[0];
        auVar61[0xe] = auVar61[0];
        auVar61[0xf] = auVar61[0];
        auVar61[0x10] = auVar61[0];
        auVar61[0x11] = auVar61[0];
        auVar61[0x12] = auVar61[0];
        auVar61[0x13] = auVar61[0];
        auVar61[0x14] = auVar61[0];
        auVar61[0x15] = auVar61[0];
        auVar61[0x16] = auVar61[0];
        auVar61[0x17] = auVar61[0];
        auVar61[0x18] = auVar61[0];
        auVar61[0x19] = auVar61[0];
        auVar61[0x1a] = auVar61[0];
        auVar61[0x1b] = auVar61[0];
        auVar61[0x1c] = auVar61[0];
        auVar61[0x1d] = auVar61[0];
        auVar61[0x1e] = auVar61[0];
        auVar61[0x1f] = auVar61[0];
        auVar68 = vpcmpeqd_avx2(auVar68,auVar68);
        auVar61 = vpaddsb_avx2(auVar61,auVar68);
        auVar62[0] = (undefined1)s2Len;
        auVar62[1] = auVar62[0];
        auVar62[2] = auVar62[0];
        auVar62[3] = auVar62[0];
        auVar62[4] = auVar62[0];
        auVar62[5] = auVar62[0];
        auVar62[6] = auVar62[0];
        auVar62[7] = auVar62[0];
        auVar62[8] = auVar62[0];
        auVar62[9] = auVar62[0];
        auVar62[10] = auVar62[0];
        auVar62[0xb] = auVar62[0];
        auVar62[0xc] = auVar62[0];
        auVar62[0xd] = auVar62[0];
        auVar62[0xe] = auVar62[0];
        auVar62[0xf] = auVar62[0];
        auVar62[0x10] = auVar62[0];
        auVar62[0x11] = auVar62[0];
        auVar62[0x12] = auVar62[0];
        auVar62[0x13] = auVar62[0];
        auVar62[0x14] = auVar62[0];
        auVar62[0x15] = auVar62[0];
        auVar62[0x16] = auVar62[0];
        auVar62[0x17] = auVar62[0];
        auVar62[0x18] = auVar62[0];
        auVar62[0x19] = auVar62[0];
        auVar62[0x1a] = auVar62[0];
        auVar62[0x1b] = auVar62[0];
        auVar62[0x1c] = auVar62[0];
        auVar62[0x1d] = auVar62[0];
        auVar62[0x1e] = auVar62[0];
        auVar62[0x1f] = auVar62[0];
        auVar68 = vpaddsb_avx2(auVar62,auVar68);
        auVar77 = vpinsrb_avx(auVar77,iVar36 + gap * -2,0xd);
        auVar77 = vpinsrb_avx(auVar77,iVar36 - gap,0xe);
        auVar3 = vpinsrb_avx(ZEXT416((uint)(gap * 0xe1 - open)),gap * 0xe2 - open,1);
        auVar3 = vpinsrb_avx(auVar3,gap * 0xe3 - open,2);
        auVar3 = vpinsrb_avx(auVar3,gap * 0xe4 - open,3);
        auVar3 = vpinsrb_avx(auVar3,gap * 0xe5 - open,4);
        auVar3 = vpinsrb_avx(auVar3,gap * 0xe6 - open,5);
        auVar3 = vpinsrb_avx(auVar3,gap * 0xe7 - open,6);
        auVar3 = vpinsrb_avx(auVar3,gap * 0xe8 - open,7);
        auVar3 = vpinsrb_avx(auVar3,gap * 0xe9 - open,8);
        auVar3 = vpinsrb_avx(auVar3,gap * 0xea - open,9);
        auVar3 = vpinsrb_avx(auVar3,gap * 0xeb - open,10);
        auVar3 = vpinsrb_avx(auVar3,gap * 0xec - open,0xb);
        auVar3 = vpinsrb_avx(auVar3,gap * 0xed - open,0xc);
        auVar3 = vpinsrb_avx(auVar3,gap * 0xee - open,0xd);
        auVar77 = vpinsrb_avx(auVar77,iVar36,0xf);
        auVar3 = vpinsrb_avx(auVar3,gap * 0xef - open,0xe);
        auVar3 = vpinsrb_avx(auVar3,iVar36 + gap * -0x10,0xf);
        local_168._0_16_ = ZEXT116(0) * auVar77 + ZEXT116(1) * auVar3;
        local_168._16_16_ = ZEXT116(1) * auVar77;
        uVar55 = 1;
        if (1 < s2Len) {
          uVar55 = (ulong)(uint)s2Len;
        }
        uVar23 = 0;
        do {
          ptr[1][uVar23 + 0xf] = (char)matrix->mapper[(byte)_s2[uVar23]];
          uVar23 = uVar23 + 1;
        } while (uVar55 != uVar23);
        *(undefined1 (*) [16])(*ptr + 0xf) = (undefined1  [16])0x0;
        *ptr = (undefined1  [16])0x0;
        uVar42 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar39) {
          uVar42 = uVar39;
        }
        uVar23 = 0;
        auVar62 = ZEXT1632(auVar65);
        auVar76 = ZEXT1664(auVar74);
        memset(ptr[1] + (ulong)(uint)s2Len + 0xf,0,(ulong)(~s2Len + uVar42) + 1);
        cVar56 = -cVar59;
        do {
          ptr_00[uVar23 + 0x1f] = cVar56;
          ptr_01[uVar23 + 0x1f] = cVar26;
          uVar23 = uVar23 + 1;
          cVar56 = cVar56 - auVar60[0];
        } while (uVar55 != uVar23);
        lVar24 = 0;
        do {
          ptr_00[lVar24] = cVar26;
          ptr_01[lVar24] = cVar26;
          lVar24 = lVar24 + 1;
        } while (lVar24 != 0x1f);
        lVar24 = (ulong)(uint)s2Len + 0x1f;
        do {
          ptr_00[lVar24] = cVar26;
          ptr_01[lVar24] = cVar26;
          lVar24 = lVar24 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar39);
        ptr_00[0x1e] = '\0';
        if ((int)uVar41 < 1) {
          auVar63[1] = cVar26;
          auVar63[0] = cVar26;
          auVar63[2] = cVar26;
          auVar63[3] = cVar26;
          auVar63[4] = cVar26;
          auVar63[5] = cVar26;
          auVar63[6] = cVar26;
          auVar63[7] = cVar26;
          auVar63[8] = cVar26;
          auVar63[9] = cVar26;
          auVar63[10] = cVar26;
          auVar63[0xb] = cVar26;
          auVar63[0xc] = cVar26;
          auVar63[0xd] = cVar26;
          auVar63[0xe] = cVar26;
          auVar63[0xf] = cVar26;
          auVar63[0x10] = cVar26;
          auVar63[0x11] = cVar26;
          auVar63[0x12] = cVar26;
          auVar63[0x13] = cVar26;
          auVar63[0x14] = cVar26;
          auVar63[0x15] = cVar26;
          auVar63[0x16] = cVar26;
          auVar63[0x17] = cVar26;
          auVar63[0x18] = cVar26;
          auVar63[0x19] = cVar26;
          auVar63[0x1a] = cVar26;
          auVar63[0x1b] = cVar26;
          auVar63[0x1c] = cVar26;
          auVar63[0x1d] = cVar26;
          auVar63[0x1e] = cVar26;
          auVar63[0x1f] = cVar26;
          auVar69 = ZEXT3264(auVar63);
          auVar66[1] = cVar33;
          auVar66[0] = cVar33;
          auVar66[2] = cVar33;
          auVar66[3] = cVar33;
          auVar66[4] = cVar33;
          auVar66[5] = cVar33;
          auVar66[6] = cVar33;
          auVar66[7] = cVar33;
          auVar66[8] = cVar33;
          auVar66[9] = cVar33;
          auVar66[10] = cVar33;
          auVar66[0xb] = cVar33;
          auVar66[0xc] = cVar33;
          auVar66[0xd] = cVar33;
          auVar66[0xe] = cVar33;
          auVar66[0xf] = cVar33;
          auVar66[0x10] = cVar33;
          auVar66[0x11] = cVar33;
          auVar66[0x12] = cVar33;
          auVar66[0x13] = cVar33;
          auVar66[0x14] = cVar33;
          auVar66[0x15] = cVar33;
          auVar66[0x16] = cVar33;
          auVar66[0x17] = cVar33;
          auVar66[0x18] = cVar33;
          auVar66[0x19] = cVar33;
          auVar66[0x1a] = cVar33;
          auVar66[0x1b] = cVar33;
          auVar66[0x1c] = cVar33;
          auVar66[0x1d] = cVar33;
          auVar66[0x1e] = cVar33;
          auVar66[0x1f] = cVar33;
        }
        else {
          auVar5[1] = cVar26;
          auVar5[0] = cVar26;
          auVar5[2] = cVar26;
          auVar5[3] = cVar26;
          auVar5[4] = cVar26;
          auVar5[5] = cVar26;
          auVar5[6] = cVar26;
          auVar5[7] = cVar26;
          auVar5[8] = cVar26;
          auVar5[9] = cVar26;
          auVar5[10] = cVar26;
          auVar5[0xb] = cVar26;
          auVar5[0xc] = cVar26;
          auVar5[0xd] = cVar26;
          auVar5[0xe] = cVar26;
          auVar5[0xf] = cVar26;
          auVar5[0x10] = cVar26;
          auVar5[0x11] = cVar26;
          auVar5[0x12] = cVar26;
          auVar5[0x13] = cVar26;
          auVar5[0x14] = cVar26;
          auVar5[0x15] = cVar26;
          auVar5[0x16] = cVar26;
          auVar5[0x17] = cVar26;
          auVar5[0x18] = cVar26;
          auVar5[0x19] = cVar26;
          auVar5[0x1a] = cVar26;
          auVar5[0x1b] = cVar26;
          auVar5[0x1c] = cVar26;
          auVar5[0x1d] = cVar26;
          auVar5[0x1e] = cVar26;
          auVar5[0x1f] = cVar26;
          auVar69 = ZEXT3264(auVar5);
          auVar6 = vpalignr_avx2(ZEXT1632(auVar5._16_16_),auVar5,1);
          uVar55 = 1;
          if (1 < (int)uVar39) {
            uVar55 = (ulong)uVar39;
          }
          uVar23 = 0;
          auVar65 = auVar6._16_16_;
          auVar73[8] = 1;
          auVar73._0_8_ = 0x101010101010101;
          auVar73[9] = 1;
          auVar73[10] = 1;
          auVar73[0xb] = 1;
          auVar73[0xc] = 1;
          auVar73[0xd] = 1;
          auVar73[0xe] = 1;
          auVar73[0xf] = 1;
          auVar73[0x10] = 1;
          auVar73[0x11] = 1;
          auVar73[0x12] = 1;
          auVar73[0x13] = 1;
          auVar73[0x14] = 1;
          auVar73[0x15] = 1;
          auVar73[0x16] = 1;
          auVar73[0x17] = 1;
          auVar73[0x18] = 1;
          auVar73[0x19] = 1;
          auVar73[0x1a] = 1;
          auVar73[0x1b] = 1;
          auVar73[0x1c] = 1;
          auVar73[0x1d] = 1;
          auVar73[0x1e] = 1;
          auVar73[0x1f] = 1;
          auVar10 = vpcmpeqd_avx2(auVar62,auVar62);
          auVar67 = ZEXT3264(CONCAT131(cVar33,CONCAT130(cVar33,CONCAT129(cVar33,CONCAT128(cVar33,
                                                  CONCAT127(cVar33,CONCAT126(cVar33,CONCAT125(cVar33
                                                  ,CONCAT124(cVar33,CONCAT123(cVar33,CONCAT122(
                                                  cVar33,CONCAT121(cVar33,CONCAT120(cVar33,CONCAT119
                                                  (cVar33,CONCAT118(cVar33,CONCAT117(cVar33,
                                                  CONCAT116(cVar33,CONCAT115(cVar33,CONCAT114(cVar33
                                                  ,CONCAT113(cVar33,CONCAT112(cVar33,CONCAT111(
                                                  cVar33,CONCAT110(cVar33,CONCAT19(cVar33,CONCAT18(
                                                  cVar33,CONCAT17(cVar33,CONCAT16(cVar33,CONCAT15(
                                                  cVar33,CONCAT14(cVar33,CONCAT13(cVar33,CONCAT12(
                                                  cVar33,CONCAT11(cVar33,cVar33)))))))))))))))))))))
                                                  )))))))))));
          auVar64 = ZEXT3264(auVar5);
          auVar62 = _DAT_008d4900;
          do {
            iVar21 = matrix->type;
            uVar41 = (uint)uVar23;
            uVar42 = uVar41;
            if (iVar21 == 0) {
              uVar42 = (uint)local_200[uVar23];
            }
            if (iVar21 == 0) {
              uVar39 = (int)local_200[uVar23 | 1];
            }
            else {
              uVar39 = uVar41 | 1;
              if (uVar58 <= (uVar23 | 1)) {
                uVar39 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar27 = (int)local_200[uVar23 | 2];
            }
            else {
              uVar27 = uVar41 | 2;
              if (uVar58 <= (uVar23 | 2)) {
                uVar27 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar28 = (int)local_200[uVar23 | 3];
            }
            else {
              uVar28 = uVar41 | 3;
              if (uVar58 <= (uVar23 | 3)) {
                uVar28 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar31 = (int)local_200[uVar23 | 4];
            }
            else {
              uVar31 = uVar41 | 4;
              if (uVar58 <= (uVar23 | 4)) {
                uVar31 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar32 = (int)local_200[uVar23 | 5];
            }
            else {
              uVar32 = uVar41 | 5;
              if (uVar58 <= (uVar23 | 5)) {
                uVar32 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar40 = (int)local_200[uVar23 | 6];
            }
            else {
              uVar40 = uVar41 | 6;
              if (uVar58 <= (uVar23 | 6)) {
                uVar40 = uVar16;
              }
            }
            piVar2 = matrix->matrix;
            iVar1 = matrix->size;
            if (iVar21 == 0) {
              uVar17 = (int)local_200[uVar23 | 7];
            }
            else {
              uVar17 = uVar41 | 7;
              if (uVar58 <= (uVar23 | 7)) {
                uVar17 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar34 = (int)local_200[uVar23 | 8];
            }
            else {
              uVar34 = uVar41 | 8;
              if (uVar58 <= (uVar23 | 8)) {
                uVar34 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar18 = (int)local_200[uVar23 | 9];
            }
            else {
              uVar18 = uVar41 | 9;
              if (uVar58 <= (uVar23 | 9)) {
                uVar18 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar43 = (int)local_200[uVar23 | 10];
            }
            else {
              uVar43 = uVar41 | 10;
              if (uVar58 <= (uVar23 | 10)) {
                uVar43 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar19 = (int)local_200[uVar23 | 0xb];
            }
            else {
              uVar19 = uVar41 | 0xb;
              if (uVar58 <= (uVar23 | 0xb)) {
                uVar19 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar20 = (int)local_200[uVar23 | 0xc];
            }
            else {
              uVar20 = uVar41 | 0xc;
              if (uVar58 <= (uVar23 | 0xc)) {
                uVar20 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar44 = (int)local_200[uVar23 | 0xd];
            }
            else {
              uVar44 = uVar41 | 0xd;
              if (uVar58 <= (uVar23 | 0xd)) {
                uVar44 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar45 = (int)local_200[uVar23 | 0xe];
            }
            else {
              uVar45 = uVar41 | 0xe;
              if (uVar58 <= (uVar23 | 0xe)) {
                uVar45 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar29 = (int)local_200[uVar23 | 0xf];
            }
            else {
              uVar29 = uVar41 | 0xf;
              if (uVar58 <= (uVar23 | 0xf)) {
                uVar29 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar30 = (int)local_200[uVar23 | 0x10];
            }
            else {
              uVar30 = uVar41 | 0x10;
              if (uVar58 <= (uVar23 | 0x10)) {
                uVar30 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar51 = (int)local_200[uVar23 | 0x11];
            }
            else {
              uVar51 = uVar41 | 0x11;
              if (uVar58 <= (uVar23 | 0x11)) {
                uVar51 = uVar16;
              }
            }
            if (iVar21 == 0) {
              local_2b0 = (int)local_200[uVar23 | 0x12];
            }
            else {
              local_2b0 = uVar41 | 0x12;
              if (uVar58 <= (uVar23 | 0x12)) {
                local_2b0 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar52 = (int)local_200[uVar23 | 0x13];
            }
            else {
              uVar52 = uVar41 | 0x13;
              if (uVar58 <= (uVar23 | 0x13)) {
                uVar52 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar53 = (int)local_200[uVar23 | 0x14];
            }
            else {
              uVar53 = uVar41 | 0x14;
              if (uVar58 <= (uVar23 | 0x14)) {
                uVar53 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar54 = (int)local_200[uVar23 | 0x15];
            }
            else {
              uVar54 = uVar41 | 0x15;
              if (uVar58 <= (uVar23 | 0x15)) {
                uVar54 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar47 = (int)local_200[uVar23 | 0x16];
            }
            else {
              uVar47 = uVar41 | 0x16;
              if (uVar58 <= (uVar23 | 0x16)) {
                uVar47 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar48 = (int)local_200[uVar23 | 0x17];
            }
            else {
              uVar48 = uVar41 | 0x17;
              if (uVar58 <= (uVar23 | 0x17)) {
                uVar48 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar49 = (int)local_200[uVar23 | 0x18];
            }
            else {
              uVar49 = uVar41 | 0x18;
              if (uVar58 <= (uVar23 | 0x18)) {
                uVar49 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar37 = (int)local_200[uVar23 | 0x19];
            }
            else {
              uVar37 = uVar41 | 0x19;
              if (uVar58 <= (uVar23 | 0x19)) {
                uVar37 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar38 = (int)local_200[uVar23 | 0x1a];
            }
            else {
              uVar38 = uVar41 | 0x1a;
              if (uVar58 <= (uVar23 | 0x1a)) {
                uVar38 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar25 = (int)local_200[uVar23 | 0x1b];
            }
            else {
              uVar25 = uVar41 | 0x1b;
              if (uVar58 <= (uVar23 | 0x1b)) {
                uVar25 = uVar16;
              }
            }
            if (iVar21 == 0) {
              local_1d0 = (int)local_200[uVar23 | 0x1c];
            }
            else {
              local_1d0 = uVar41 | 0x1c;
              if (uVar58 <= (uVar23 | 0x1c)) {
                local_1d0 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar35 = (int)local_200[uVar23 | 0x1d];
            }
            else {
              uVar35 = uVar41 | 0x1d;
              if (uVar58 <= (uVar23 | 0x1d)) {
                uVar35 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar46 = (int)local_200[uVar23 | 0x1e];
            }
            else {
              uVar46 = uVar41 | 0x1e;
              if (uVar58 <= (uVar23 | 0x1e)) {
                uVar46 = uVar16;
              }
            }
            if (iVar21 == 0) {
              uVar50 = (int)local_200[uVar23 | 0x1f];
            }
            else {
              uVar50 = uVar41 | 0x1f;
              if (uVar58 <= (uVar23 | 0x1f)) {
                uVar50 = uVar16;
              }
            }
            uVar23 = uVar23 + 0x20;
            auVar74 = vpinsrb_avx(auVar65,(uint)(byte)ptr_00[0x1e],0xf);
            ptr_00[0x1e] = (char)iVar36 - (char)uVar23 * auVar60[0];
            auVar77 = vpinsrb_avx(auVar65,iVar36 - uVar41 * gap,0xf);
            auVar75._0_16_ = ZEXT116(0) * auVar77 + ZEXT116(1) * auVar6._0_16_;
            auVar75._32_32_ = auVar76._32_32_;
            auVar75._16_16_ = ZEXT116(0) * auVar65 + ZEXT116(1) * auVar77;
            auVar77 = ZEXT116(0) * auVar74 + ZEXT116(1) * auVar6._0_16_;
            auVar74 = ZEXT116(0) * auVar65 + ZEXT116(1) * auVar74;
            auVar9 = vpcmpeqb_avx2(auVar62,auVar61);
            auVar12[1] = cVar26;
            auVar12[0] = cVar26;
            auVar12[2] = cVar26;
            auVar12[3] = cVar26;
            auVar12[4] = cVar26;
            auVar12[5] = cVar26;
            auVar12[6] = cVar26;
            auVar12[7] = cVar26;
            auVar12[8] = cVar26;
            auVar12[9] = cVar26;
            auVar12[10] = cVar26;
            auVar12[0xb] = cVar26;
            auVar12[0xc] = cVar26;
            auVar12[0xd] = cVar26;
            auVar12[0xe] = cVar26;
            auVar12[0xf] = cVar26;
            auVar12[0x10] = cVar26;
            auVar12[0x11] = cVar26;
            auVar12[0x12] = cVar26;
            auVar12[0x13] = cVar26;
            auVar12[0x14] = cVar26;
            auVar12[0x15] = cVar26;
            auVar12[0x16] = cVar26;
            auVar12[0x17] = cVar26;
            auVar12[0x18] = cVar26;
            auVar12[0x19] = cVar26;
            auVar12[0x1a] = cVar26;
            auVar12[0x1b] = cVar26;
            auVar12[0x1c] = cVar26;
            auVar12[0x1d] = cVar26;
            auVar12[0x1e] = cVar26;
            auVar12[0x1f] = cVar26;
            uVar57 = 0;
            auVar76 = auVar75;
            auVar5 = _DAT_008d4b20;
            auVar13 = auVar12;
            do {
              auVar3 = vpinsrb_avx(ZEXT416((uint)piVar2[(long)(int)(uVar29 * iVar1) +
                                                        (long)(char)ptr[1][uVar57]]),
                                   (uint)*(byte *)(piVar2 + (long)(int)(uVar45 * iVar1) +
                                                            (long)(char)ptr[1][uVar57 + 1]),1);
              auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar44 * iVar1) +
                                                                   (long)(char)ptr[1][uVar57 + 2]),2
                                  );
              auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar20 * iVar1) +
                                                                   (long)(char)ptr[1][uVar57 + 3]),3
                                  );
              auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar19 * iVar1) +
                                                                   (long)(char)ptr[1][uVar57 + 4]),4
                                  );
              auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar43 * iVar1) +
                                                                   (long)(char)ptr[1][uVar57 + 5]),5
                                  );
              auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar18 * iVar1) +
                                                                   (long)(char)ptr[1][uVar57 + 6]),6
                                  );
              auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar34 * iVar1) +
                                                                   (long)(char)ptr[1][uVar57 + 7]),7
                                  );
              auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar17 * iVar1) +
                                                                   (long)(char)ptr[1][uVar57 + 8]),8
                                  );
              auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar40 * iVar1) +
                                                                   (long)(char)ptr[1][uVar57 + 9]),9
                                  );
              auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar32 * iVar1) +
                                                                   (long)(char)ptr[1][uVar57 + 10]),
                                   10);
              auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar31 * iVar1) +
                                                                   (long)(char)ptr[1][uVar57 + 0xb])
                                   ,0xb);
              auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar28 * iVar1) +
                                                                   (long)(char)ptr[1][uVar57 + 0xc])
                                   ,0xc);
              auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar27 * iVar1) +
                                                                   (long)(char)ptr[1][uVar57 + 0xd])
                                   ,0xd);
              auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar39 * iVar1) +
                                                                   (long)(char)ptr[1][uVar57 + 0xe])
                                   ,0xe);
              auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar42 * iVar1) +
                                                                   (long)(char)ptr[1][uVar57 + 0xf])
                                   ,0xf);
              auVar4 = vpinsrb_avx(ZEXT416((uint)piVar2[(long)(int)(uVar50 * iVar1) +
                                                        (long)(char)(*ptr)[uVar57]]),
                                   (uint)*(byte *)(piVar2 + (long)(int)(uVar46 * iVar1) +
                                                            (long)(char)(*ptr)[uVar57 + 1]),1);
              auVar4 = vpinsrb_avx(auVar4,(uint)*(byte *)(piVar2 + (long)(int)(uVar35 * iVar1) +
                                                                   (long)(char)(*ptr)[uVar57 + 2]),2
                                  );
              auVar4 = vpinsrb_avx(auVar4,(uint)*(byte *)(piVar2 + (long)(int)(local_1d0 * iVar1) +
                                                                   (long)(char)(*ptr)[uVar57 + 3]),3
                                  );
              auVar4 = vpinsrb_avx(auVar4,(uint)*(byte *)(piVar2 + (long)(int)(uVar25 * iVar1) +
                                                                   (long)(char)(*ptr)[uVar57 + 4]),4
                                  );
              auVar4 = vpinsrb_avx(auVar4,(uint)*(byte *)(piVar2 + (long)(int)(uVar38 * iVar1) +
                                                                   (long)(char)(*ptr)[uVar57 + 5]),5
                                  );
              auVar4 = vpinsrb_avx(auVar4,(uint)*(byte *)(piVar2 + (long)(int)(uVar37 * iVar1) +
                                                                   (long)(char)(*ptr)[uVar57 + 6]),6
                                  );
              auVar4 = vpinsrb_avx(auVar4,(uint)*(byte *)(piVar2 + (long)(int)(uVar49 * iVar1) +
                                                                   (long)(char)(*ptr)[uVar57 + 7]),7
                                  );
              auVar4 = vpinsrb_avx(auVar4,(uint)*(byte *)(piVar2 + (long)(int)(uVar48 * iVar1) +
                                                                   (long)(char)(*ptr)[uVar57 + 8]),8
                                  );
              auVar4 = vpinsrb_avx(auVar4,(uint)*(byte *)(piVar2 + (long)(int)(uVar47 * iVar1) +
                                                                   (long)(char)(*ptr)[uVar57 + 9]),9
                                  );
              auVar4 = vpinsrb_avx(auVar4,(uint)*(byte *)(piVar2 + (long)(int)(uVar54 * iVar1) +
                                                                   (long)(char)(*ptr)[uVar57 + 10]),
                                   10);
              auVar4 = vpinsrb_avx(auVar4,(uint)*(byte *)(piVar2 + (long)(int)(uVar53 * iVar1) +
                                                                   (long)(char)(*ptr)[uVar57 + 0xb])
                                   ,0xb);
              auVar4 = vpinsrb_avx(auVar4,(uint)*(byte *)(piVar2 + (long)(int)(uVar52 * iVar1) +
                                                                   (long)(char)(*ptr)[uVar57 + 0xc])
                                   ,0xc);
              auVar4 = vpinsrb_avx(auVar4,(uint)*(byte *)(piVar2 + (long)(int)(local_2b0 * iVar1) +
                                                                   (long)(char)(*ptr)[uVar57 + 0xd])
                                   ,0xd);
              auVar4 = vpinsrb_avx(auVar4,(uint)*(byte *)(piVar2 + (long)(int)(uVar51 * iVar1) +
                                                                   (long)(char)(*ptr)[uVar57 + 0xe])
                                   ,0xe);
              auVar4 = vpinsrb_avx(auVar4,(uint)*(byte *)(piVar2 + (long)(int)(uVar30 * iVar1) +
                                                                   (long)(char)(*ptr)[uVar57 + 0xf])
                                   ,0xf);
              auVar70[0] = auVar76[0x10];
              auVar70[1] = auVar70[0];
              auVar70[2] = auVar70[0];
              auVar70[3] = auVar70[0];
              auVar70[4] = auVar70[0];
              auVar70[5] = auVar70[0];
              auVar70[6] = auVar70[0];
              auVar70[7] = auVar70[0];
              auVar70[8] = auVar70[0];
              auVar70[9] = auVar70[0];
              auVar70[10] = auVar70[0];
              auVar70[0xb] = auVar70[0];
              auVar70[0xc] = auVar70[0];
              auVar70[0xd] = auVar70[0];
              auVar70[0xe] = auVar70[0];
              auVar70[0xf] = auVar70[0];
              auVar70[0x10] = auVar70[0];
              auVar70[0x11] = auVar70[0];
              auVar70[0x12] = auVar70[0];
              auVar70[0x13] = auVar70[0];
              auVar70[0x14] = auVar70[0];
              auVar70[0x15] = auVar70[0];
              auVar70[0x16] = auVar70[0];
              auVar70[0x17] = auVar70[0];
              auVar70[0x18] = auVar70[0];
              auVar70[0x19] = auVar70[0];
              auVar70[0x1a] = auVar70[0];
              auVar70[0x1b] = auVar70[0];
              auVar70[0x1c] = auVar70[0];
              auVar70[0x1d] = auVar70[0];
              auVar70[0x1e] = auVar70[0];
              auVar70[0x1f] = auVar70[0];
              auVar66 = vpalignr_avx2(auVar70,auVar76._0_32_,1);
              auVar72._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar4;
              auVar72._16_16_ = ZEXT116(1) * auVar3;
              auVar3 = vpinsrb_avx(auVar66._16_16_,(uint)(byte)ptr_00[uVar57 + 0x1f],0xf);
              auVar8._16_8_ = auVar74._0_8_;
              auVar8._0_16_ = auVar77;
              auVar8._24_8_ = auVar74._8_8_;
              auVar63 = vpaddsb_avx2(auVar8,auVar72);
              auVar77 = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar66._0_16_;
              auVar74 = ZEXT116(0) * auVar66._16_16_ + ZEXT116(1) * auVar3;
              auVar66 = vpalignr_avx2(ZEXT1632(auVar12._16_16_),auVar12,1);
              auVar3 = vpinsrb_avx(auVar66._16_16_,(uint)(byte)ptr_01[uVar57 + 0x1f],0xf);
              auVar71._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar66._0_16_;
              auVar71._16_16_ = ZEXT116(0) * auVar66._16_16_ + ZEXT116(1) * auVar3;
              auVar15[1] = cVar59;
              auVar15[0] = cVar59;
              auVar15[2] = cVar59;
              auVar15[3] = cVar59;
              auVar15[4] = cVar59;
              auVar15[5] = cVar59;
              auVar15[6] = cVar59;
              auVar15[7] = cVar59;
              auVar15[8] = cVar59;
              auVar15[9] = cVar59;
              auVar15[10] = cVar59;
              auVar15[0xb] = cVar59;
              auVar15[0xc] = cVar59;
              auVar15[0xd] = cVar59;
              auVar15[0xe] = cVar59;
              auVar15[0xf] = cVar59;
              auVar15[0x10] = cVar59;
              auVar15[0x11] = cVar59;
              auVar15[0x12] = cVar59;
              auVar15[0x13] = cVar59;
              auVar15[0x14] = cVar59;
              auVar15[0x15] = cVar59;
              auVar15[0x16] = cVar59;
              auVar15[0x17] = cVar59;
              auVar15[0x18] = cVar59;
              auVar15[0x19] = cVar59;
              auVar15[0x1a] = cVar59;
              auVar15[0x1b] = cVar59;
              auVar15[0x1c] = cVar59;
              auVar15[0x1d] = cVar59;
              auVar15[0x1e] = cVar59;
              auVar15[0x1f] = cVar59;
              auVar11._16_8_ = auVar74._0_8_;
              auVar11._0_16_ = auVar77;
              auVar11._24_8_ = auVar74._8_8_;
              auVar66 = vpsubsb_avx2(auVar11,auVar15);
              auVar12 = vpsubsb_avx2(auVar71,auVar60);
              auVar12 = vpmaxsb_avx2(auVar66,auVar12);
              auVar66 = vpsubsb_avx2(auVar76._0_32_,auVar15);
              auVar13 = vpsubsb_avx2(auVar13,auVar60);
              auVar11 = vpmaxsb_avx2(auVar66,auVar13);
              auVar66 = vpmaxsb_avx2(auVar11,auVar12);
              auVar63 = vpmaxsb_avx2(auVar63,auVar66);
              auVar13 = vpcmpeqb_avx2(auVar5,auVar10);
              auVar8 = vpblendvb_avx2(auVar63,local_168,auVar13);
              auVar76 = ZEXT3264(auVar8);
              if (0x1f < uVar57) {
                auVar63 = vpminsb_avx2(auVar67._0_32_,auVar8);
                auVar67 = ZEXT3264(auVar63);
                auVar63 = vpmaxsb_avx2(auVar64._0_32_,auVar8);
                auVar64 = ZEXT3264(auVar63);
              }
              auVar63 = auVar64._0_32_;
              auVar66 = auVar67._0_32_;
              auVar14[1] = cVar26;
              auVar14[0] = cVar26;
              auVar14[2] = cVar26;
              auVar14[3] = cVar26;
              auVar14[4] = cVar26;
              auVar14[5] = cVar26;
              auVar14[6] = cVar26;
              auVar14[7] = cVar26;
              auVar14[8] = cVar26;
              auVar14[9] = cVar26;
              auVar14[10] = cVar26;
              auVar14[0xb] = cVar26;
              auVar14[0xc] = cVar26;
              auVar14[0xd] = cVar26;
              auVar14[0xe] = cVar26;
              auVar14[0xf] = cVar26;
              auVar14[0x10] = cVar26;
              auVar14[0x11] = cVar26;
              auVar14[0x12] = cVar26;
              auVar14[0x13] = cVar26;
              auVar14[0x14] = cVar26;
              auVar14[0x15] = cVar26;
              auVar14[0x16] = cVar26;
              auVar14[0x17] = cVar26;
              auVar14[0x18] = cVar26;
              auVar14[0x19] = cVar26;
              auVar14[0x1a] = cVar26;
              auVar14[0x1b] = cVar26;
              auVar14[0x1c] = cVar26;
              auVar14[0x1d] = cVar26;
              auVar14[0x1e] = cVar26;
              auVar14[0x1f] = cVar26;
              auVar12 = vpblendvb_avx2(auVar12,auVar14,auVar13);
              auVar13 = vpblendvb_avx2(auVar11,auVar14,auVar13);
              ptr_00[uVar57] = auVar8[0];
              ptr_01[uVar57] = auVar12[0];
              auVar11 = vpcmpeqb_avx2(auVar5,auVar68);
              auVar11 = vpand_avx2(auVar9,auVar11);
              auVar8 = vpblendvb_avx2(auVar69._0_32_,auVar8,auVar11);
              auVar69 = ZEXT3264(auVar8);
              auVar5 = vpaddsb_avx2(auVar5,auVar73);
              uVar57 = uVar57 + 1;
            } while (uVar55 != uVar57);
            auVar13[8] = 0x20;
            auVar13._0_8_ = 0x2020202020202020;
            auVar13[9] = 0x20;
            auVar13[10] = 0x20;
            auVar13[0xb] = 0x20;
            auVar13[0xc] = 0x20;
            auVar13[0xd] = 0x20;
            auVar13[0xe] = 0x20;
            auVar13[0xf] = 0x20;
            auVar13[0x10] = 0x20;
            auVar13[0x11] = 0x20;
            auVar13[0x12] = 0x20;
            auVar13[0x13] = 0x20;
            auVar13[0x14] = 0x20;
            auVar13[0x15] = 0x20;
            auVar13[0x16] = 0x20;
            auVar13[0x17] = 0x20;
            auVar13[0x18] = 0x20;
            auVar13[0x19] = 0x20;
            auVar13[0x1a] = 0x20;
            auVar13[0x1b] = 0x20;
            auVar13[0x1c] = 0x20;
            auVar13[0x1d] = 0x20;
            auVar13[0x1e] = 0x20;
            auVar13[0x1f] = 0x20;
            auVar62 = vpaddsb_avx2(auVar62,auVar13);
            local_168 = vpsubsb_avx2(local_168,auVar7);
          } while (uVar23 < uVar58);
        }
        iVar21 = 0x20;
        cVar59 = cVar26;
        do {
          if (cVar59 < auVar69[0x17]) {
            cVar59 = auVar69[0x17];
          }
          auVar68 = auVar69._0_32_;
          auVar61 = vperm2i128_avx2(auVar68,auVar68,0x28);
          auVar61 = vpalignr_avx2(auVar68,auVar61,0xf);
          auVar69 = ZEXT3264(auVar61);
          iVar21 = iVar21 + -1;
        } while (iVar21 != 0);
        auVar7[1] = cVar26;
        auVar7[0] = cVar26;
        auVar7[2] = cVar26;
        auVar7[3] = cVar26;
        auVar7[4] = cVar26;
        auVar7[5] = cVar26;
        auVar7[6] = cVar26;
        auVar7[7] = cVar26;
        auVar7[8] = cVar26;
        auVar7[9] = cVar26;
        auVar7[10] = cVar26;
        auVar7[0xb] = cVar26;
        auVar7[0xc] = cVar26;
        auVar7[0xd] = cVar26;
        auVar7[0xe] = cVar26;
        auVar7[0xf] = cVar26;
        auVar7[0x10] = cVar26;
        auVar7[0x11] = cVar26;
        auVar7[0x12] = cVar26;
        auVar7[0x13] = cVar26;
        auVar7[0x14] = cVar26;
        auVar7[0x15] = cVar26;
        auVar7[0x16] = cVar26;
        auVar7[0x17] = cVar26;
        auVar7[0x18] = cVar26;
        auVar7[0x19] = cVar26;
        auVar7[0x1a] = cVar26;
        auVar7[0x1b] = cVar26;
        auVar7[0x1c] = cVar26;
        auVar7[0x1d] = cVar26;
        auVar7[0x1e] = cVar26;
        auVar7[0x1f] = cVar26;
        auVar61 = vpcmpgtb_avx2(auVar7,auVar66);
        auVar6[1] = cVar33;
        auVar6[0] = cVar33;
        auVar6[2] = cVar33;
        auVar6[3] = cVar33;
        auVar6[4] = cVar33;
        auVar6[5] = cVar33;
        auVar6[6] = cVar33;
        auVar6[7] = cVar33;
        auVar6[8] = cVar33;
        auVar6[9] = cVar33;
        auVar6[10] = cVar33;
        auVar6[0xb] = cVar33;
        auVar6[0xc] = cVar33;
        auVar6[0xd] = cVar33;
        auVar6[0xe] = cVar33;
        auVar6[0xf] = cVar33;
        auVar6[0x10] = cVar33;
        auVar6[0x11] = cVar33;
        auVar6[0x12] = cVar33;
        auVar6[0x13] = cVar33;
        auVar6[0x14] = cVar33;
        auVar6[0x15] = cVar33;
        auVar6[0x16] = cVar33;
        auVar6[0x17] = cVar33;
        auVar6[0x18] = cVar33;
        auVar6[0x19] = cVar33;
        auVar6[0x1a] = cVar33;
        auVar6[0x1b] = cVar33;
        auVar6[0x1c] = cVar33;
        auVar6[0x1d] = cVar33;
        auVar6[0x1e] = cVar33;
        auVar6[0x1f] = cVar33;
        auVar68 = vpcmpgtb_avx2(auVar63,auVar6);
        auVar61 = vpor_avx2(auVar61,auVar68);
        if ((((((((((((((((((((((((((((((((auVar61 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar61 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar61 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar61 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar61 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar61 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar61 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar61 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar61 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar61 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar61 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar61 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar61 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar61 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar61 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar61 >> 0x7f,0) != '\0') ||
                          (auVar61 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar61 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar61 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar61 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar61 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar61 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar61 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar61 >> 0xbf,0) != '\0') ||
                  (auVar61 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar61 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar61 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar61 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar61 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar61 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar61 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            auVar61[0x1f] < '\0') {
          *(byte *)&ppVar22->flag = (byte)ppVar22->flag | 0x40;
          cVar59 = '\0';
          local_224 = 0;
          uVar16 = 0;
        }
        ppVar22->score = (int)cVar59;
        ppVar22->end_query = uVar16;
        ppVar22->end_ref = local_224;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(local_200);
          return ppVar22;
        }
        return ppVar22;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int8_t * restrict s1 = NULL;
    int8_t * restrict s2B = NULL;
    int8_t * restrict _H_pr = NULL;
    int8_t * restrict _F_pr = NULL;
    int8_t * restrict s2 = NULL;
    int8_t * restrict H_pr = NULL;
    int8_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMax;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 32; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi8(NEG_LIMIT);
    vOpen = _mm256_set1_epi8(open);
    vGap  = _mm256_set1_epi8(gap);
    vOne = _mm256_set1_epi8(1);
    vN = _mm256_set1_epi8(N);
    vGapN = _mm256_set1_epi8(gap*N);
    vNegOne = _mm256_set1_epi8(-1);
    vI = _mm256_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15,16,17,18,19,20,21,22,23,24,25,26,27,28,29,30,31);
    vJreset = _mm256_set_epi8(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15,-16,-17,-18,-19,-20,-21,-22,-23,-24,-25,-26,-27,-28,-29,-30,-31);
    vMax = vNegInf;
    vILimit = _mm256_set1_epi8(s1Len);
    vILimit1 = _mm256_subs_epi8(vILimit, vOne);
    vJLimit = _mm256_set1_epi8(s2Len);
    vJLimit1 = _mm256_subs_epi8(vJLimit, vOne);
    vIBoundary = _mm256_set_epi8(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap,
            -open-8*gap,
            -open-9*gap,
            -open-10*gap,
            -open-11*gap,
            -open-12*gap,
            -open-13*gap,
            -open-14*gap,
            -open-15*gap,
            -open-16*gap,
            -open-17*gap,
            -open-18*gap,
            -open-19*gap,
            -open-20*gap,
            -open-21*gap,
            -open-22*gap,
            -open-23*gap,
            -open-24*gap,
            -open-25*gap,
            -open-26*gap,
            -open-27*gap,
            -open-28*gap,
            -open-29*gap,
            -open-30*gap,
            -open-31*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int8_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int8_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int8_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int8_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        const int * const restrict matrow16 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+16] : ((i+16 >= s1Len) ? s1Len-1 : i+16))];
        const int * const restrict matrow17 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+17] : ((i+17 >= s1Len) ? s1Len-1 : i+17))];
        const int * const restrict matrow18 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+18] : ((i+18 >= s1Len) ? s1Len-1 : i+18))];
        const int * const restrict matrow19 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+19] : ((i+19 >= s1Len) ? s1Len-1 : i+19))];
        const int * const restrict matrow20 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+20] : ((i+20 >= s1Len) ? s1Len-1 : i+20))];
        const int * const restrict matrow21 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+21] : ((i+21 >= s1Len) ? s1Len-1 : i+21))];
        const int * const restrict matrow22 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+22] : ((i+22 >= s1Len) ? s1Len-1 : i+22))];
        const int * const restrict matrow23 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+23] : ((i+23 >= s1Len) ? s1Len-1 : i+23))];
        const int * const restrict matrow24 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+24] : ((i+24 >= s1Len) ? s1Len-1 : i+24))];
        const int * const restrict matrow25 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+25] : ((i+25 >= s1Len) ? s1Len-1 : i+25))];
        const int * const restrict matrow26 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+26] : ((i+26 >= s1Len) ? s1Len-1 : i+26))];
        const int * const restrict matrow27 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+27] : ((i+27 >= s1Len) ? s1Len-1 : i+27))];
        const int * const restrict matrow28 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+28] : ((i+28 >= s1Len) ? s1Len-1 : i+28))];
        const int * const restrict matrow29 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+29] : ((i+29 >= s1Len) ? s1Len-1 : i+29))];
        const int * const restrict matrow30 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+30] : ((i+30 >= s1Len) ? s1Len-1 : i+30))];
        const int * const restrict matrow31 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+31] : ((i+31 >= s1Len) ? s1Len-1 : i+31))];
        vNH = _mm256_srli_si256_rpl(vNH, 1);
        vNH = _mm256_insert_epi8_rpl(vNH, H_pr[-1], 31);
        vWH = _mm256_srli_si256_rpl(vWH, 1);
        vWH = _mm256_insert_epi8_rpl(vWH, -open - i*gap, 31);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 1);
            vNH = _mm256_insert_epi8_rpl(vNH, H_pr[j], 31);
            vF = _mm256_srli_si256_rpl(vF, 1);
            vF = _mm256_insert_epi8_rpl(vF, F_pr[j], 31);
            vF = _mm256_max_epi8(
                    _mm256_subs_epi8(vNH, vOpen),
                    _mm256_subs_epi8(vF, vGap));
            vE = _mm256_max_epi8(
                    _mm256_subs_epi8(vWH, vOpen),
                    _mm256_subs_epi8(vE, vGap));
            vMat = _mm256_set_epi8(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]],
                    matrow16[s2[j-16]],
                    matrow17[s2[j-17]],
                    matrow18[s2[j-18]],
                    matrow19[s2[j-19]],
                    matrow20[s2[j-20]],
                    matrow21[s2[j-21]],
                    matrow22[s2[j-22]],
                    matrow23[s2[j-23]],
                    matrow24[s2[j-24]],
                    matrow25[s2[j-25]],
                    matrow26[s2[j-26]],
                    matrow27[s2[j-27]],
                    matrow28[s2[j-28]],
                    matrow29[s2[j-29]],
                    matrow30[s2[j-30]],
                    matrow31[s2[j-31]]
                    );
            vNWH = _mm256_adds_epi8(vNWH, vMat);
            vWH = _mm256_max_epi8(vNWH, vE);
            vWH = _mm256_max_epi8(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi8(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-31] = (int8_t)_mm256_extract_epi8_rpl(vWH,0);
            F_pr[j-31] = (int8_t)_mm256_extract_epi8_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m256i cond_valid_I = _mm256_cmpeq_epi8(vI, vILimit1);
                __m256i cond_valid_J = _mm256_cmpeq_epi8(vJ, vJLimit1);
                __m256i cond_all = _mm256_and_si256(cond_valid_I, cond_valid_J);
                vMax = _mm256_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm256_adds_epi8(vJ, vOne);
        }
        vI = _mm256_adds_epi8(vI, vN);
        vIBoundary = _mm256_subs_epi8(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int8_t value;
        value = (int8_t) _mm256_extract_epi8_rpl(vMax, 31);
        if (value > score) {
            score = value;
        }
        vMax = _mm256_slli_si256_rpl(vMax, 1);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}